

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

int mbedtls_des_key_check_weak(uchar *key)

{
  uchar *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 + 8 == 0x88) {
      return 0;
    }
    puVar1 = weak_key_table[0] + lVar2;
    lVar2 = lVar2 + 8;
  } while (*(long *)puVar1 != *(long *)key);
  return 1;
}

Assistant:

int mbedtls_des_key_check_weak( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < WEAK_KEY_COUNT; i++ )
        if( memcmp( weak_key_table[i], key, MBEDTLS_DES_KEY_SIZE) == 0 )
            return( 1 );

    return( 0 );
}